

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O0

void __thiscall CPT::CPT(CPT *this,size_t X,size_t Y)

{
  ulong in_RDX;
  ulong in_RSI;
  CPDDiscreteInterface *in_RDI;
  size_t y;
  size_t x;
  size_type in_stack_ffffffffffffffa8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffb0;
  ulong local_38;
  size_type in_stack_ffffffffffffffd0;
  ulong uVar1;
  size_type in_stack_ffffffffffffffd8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffe0;
  
  CPDDiscreteInterface::CPDDiscreteInterface(in_RDI);
  in_RDI->_vptr_CPDDiscreteInterface = (_func_int **)&PTR__CPT_00d4d0b8;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  for (uVar1 = 0; uVar1 < in_RSI; uVar1 = uVar1 + 1) {
    for (local_38 = 0; local_38 < in_RDX; local_38 = local_38 + 1) {
      in_stack_ffffffffffffffb0 =
           (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)boost::numeric::ublas::
              matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              ::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0xb01ea5);
      in_stack_ffffffffffffffb0->size1_ = 0;
    }
  }
  return;
}

Assistant:

CPT::CPT(size_t X, size_t Y)
    :
    _m_probTable(X,Y)
{   
   for(size_t x=0; x < X; x++) 
       for(size_t y=0; y < Y; y++) 
           _m_probTable(x,y)=0;
}